

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::enterNode
          (FastInstancesIterator *this,Node **curr)

{
  void ***pppvVar1;
  uint uVar2;
  Node *pNVar3;
  long *plVar4;
  ulong uVar5;
  NodeAlgorithm NVar6;
  int iVar7;
  Entry *pEVar8;
  Node *pNVar9;
  undefined4 extraout_var;
  Node *pNVar10;
  uint *puVar11;
  void **ppvVar12;
  NodeAlgorithm *pNVar13;
  void *pvVar14;
  bool bVar15;
  Top TVar16;
  TermList local_30;
  
  pNVar3 = *curr;
  NVar6 = (*pNVar3->_vptr_Node[5])(pNVar3);
  local_30._content = (uint64_t)(*(int *)&pNVar3[1]._vptr_Node * 4 + 3);
  pEVar8 = Lib::
           DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&(this->_subst)._bindings,&local_30);
  if (pEVar8 == (Entry *)0x0) {
    local_30._content = 1;
  }
  else {
    local_30._content = (pEVar8->_val).t._content;
  }
  *curr = (Node *)0x0;
  if (NVar6 != UNSORTED_LIST) {
    if ((local_30._content & 3) == 0) {
      TVar16 = Kernel::TermList::top(&local_30);
      iVar7 = (*pNVar3->_vptr_Node[10])
                        (pNVar3,TVar16._inner._inner._0_8_,
                         (ulong)(TVar16._inner._inner._8_4_ & 0xff),0);
      if ((long *)CONCAT44(extraout_var,iVar7) == (long *)0x0) {
        pNVar10 = *curr;
      }
      else {
        pNVar10 = *(Node **)CONCAT44(extraout_var,iVar7);
        *curr = pNVar10;
      }
      pvVar14 = (void *)0x0;
    }
    else {
      plVar4 = *(long **)(pNVar3[1]._term._content + 8);
      pNVar10 = (Node *)*plVar4;
      *curr = pNVar10;
      pvVar14 = (void *)plVar4[1];
    }
    if (pNVar10 != (Node *)0x0) {
      uVar2 = *(uint *)&pNVar3[1]._vptr_Node;
      puVar11 = (this->_specVarNumbers)._cursor;
      if (puVar11 == (this->_specVarNumbers)._end) {
        Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
        puVar11 = (this->_specVarNumbers)._cursor;
      }
      *puVar11 = uVar2;
      (this->_specVarNumbers)._cursor = puVar11 + 1;
    }
    if (pvVar14 == (void *)0x0) {
      return false;
    }
    ppvVar12 = (this->_alternatives)._cursor;
    if (ppvVar12 == (this->_alternatives)._end) {
      Lib::Stack<void_*>::expand(&this->_alternatives);
      ppvVar12 = (this->_alternatives)._cursor;
    }
    *ppvVar12 = pvVar14;
    pppvVar1 = &(this->_alternatives)._cursor;
    *pppvVar1 = *pppvVar1 + 1;
    pNVar13 = (this->_nodeTypes)._cursor;
    if (pNVar13 == (this->_nodeTypes)._end) {
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
      expand(&this->_nodeTypes);
      pNVar13 = (this->_nodeTypes)._cursor;
    }
    *pNVar13 = NVar6;
    goto LAB_003144d8;
  }
  bVar15 = (local_30._content & 3) == 0;
  if (bVar15) {
    pNVar10 = (Node *)&pNVar3[1]._term;
    pNVar9 = (Node *)((TermList *)pNVar10)->_content;
    if (pNVar9 != (Node *)0x0) {
      do {
        uVar5 = (pNVar9->_term)._content;
        if (((uVar5 & 3) == 0) && (*(int *)(uVar5 + 8) == *(int *)(local_30._content + 8))) {
          *curr = pNVar9;
          goto LAB_0031430e;
        }
        pNVar9 = (Node *)(pNVar10->_term)._content;
        pNVar10 = (Node *)&pNVar10->_term;
      } while (pNVar9 != (Node *)0x0);
    }
LAB_00314395:
    bVar15 = false;
  }
  else {
    pNVar9 = (Node *)pNVar3[1]._term._content;
    *curr = pNVar9;
    pNVar10 = pNVar3 + 2;
    if (pNVar9 == (Node *)0x0) goto LAB_00314395;
LAB_0031430e:
    uVar2 = *(uint *)&pNVar3[1]._vptr_Node;
    puVar11 = (this->_specVarNumbers)._cursor;
    if (puVar11 == (this->_specVarNumbers)._end) {
      Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      puVar11 = (this->_specVarNumbers)._cursor;
    }
    *puVar11 = uVar2;
    (this->_specVarNumbers)._cursor = puVar11 + 1;
  }
  if (bVar15) {
    return false;
  }
  if (pNVar10->_vptr_Node == (_func_int **)0x0) {
    return false;
  }
  ppvVar12 = (this->_alternatives)._cursor;
  if (ppvVar12 == (this->_alternatives)._end) {
    Lib::Stack<void_*>::expand(&this->_alternatives);
    ppvVar12 = (this->_alternatives)._cursor;
  }
  *ppvVar12 = pNVar10;
  pppvVar1 = &(this->_alternatives)._cursor;
  *pppvVar1 = *pppvVar1 + 1;
  pNVar13 = (this->_nodeTypes)._cursor;
  if (pNVar13 == (this->_nodeTypes)._end) {
    Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
    expand(&this->_nodeTypes);
    pNVar13 = (this->_nodeTypes)._cursor;
  }
  *pNVar13 = UNSORTED_LIST;
LAB_003144d8:
  (this->_nodeTypes)._cursor = pNVar13 + 1;
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::enterNode(Node*& curr)
{
  ASS(!curr->isLeaf());

  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList query;
  typename InstMatcher::TermSpec querySpec;
  //here we are interested only in the top functor or the fact that the query is a variable
  //so we can discard the information about term origin
  if(_subst.findSpecVarBinding(inode->childVar, querySpec)) {
    query=querySpec.t;
  }
  else {
    query.makeVar(0);//just an arbitrary variable so that anything will match
  }

  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    ASS(*nl); //inode is not empty
    bool noAlternatives=false;
    if(query.isTerm()) {
      unsigned bindingFunctor=query.term()->functor();
      //let's skip terms that don't have the same top functor...
      while(*nl && (!(*nl)->term().isTerm() || (*nl)->term().term()->functor()!=bindingFunctor)) {
        nl++;
      }

      if(*nl) {
	//we've found the term with the same top functor
	ASS_EQ((*nl)->term().term()->functor(),bindingFunctor);
        curr=*nl;
        noAlternatives=true; //there is at most one term with each top functor
      }
    } else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=*nl;
      nl++;
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl && !noAlternatives) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    ASS(nl); //inode is not empty
    if(query.isTerm()) {
      //only term with the same top functor will be matched by a term
      Node** byTop=inode->childByTop(query.top(), false);
      if(byTop) {
	curr=*byTop;
      }
      nl=0;
    }
    else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=nl->head();
      nl=nl->tail();
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}